

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeAllocator::Init(FixedSizeAllocator *this,FixedSizeAllocatorInfo *info)

{
  pointer puVar1;
  __uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_> __p;
  const_reference pvVar2;
  const_reference pvVar3;
  __uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_> *this_00;
  InternalException *this_01;
  ulong __n;
  unsigned_long *buffer_id_1;
  pointer __v;
  __uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_> local_98;
  value_type segment_count;
  vector<unsigned_long,_true> *local_88;
  vector<duckdb::BlockPointer,_true> *local_80;
  ulong local_78;
  vector<unsigned_long,_true> *local_70;
  value_type allocation_size;
  value_type buffer_id;
  value_type buffer_block_pointer;
  
  this->segment_size = info->segment_size;
  this->total_segment_count = 0;
  local_70 = &info->buffer_ids;
  local_78 = 0x7ffffffffff080;
  local_80 = &info->block_pointers;
  local_88 = &info->segment_counts;
  __n = 0;
  while( true ) {
    if ((ulong)((long)(info->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                      .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(info->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                      .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= __n) {
      puVar1 = (info->buffers_with_free_space).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__v = (info->buffers_with_free_space).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start; __v != puVar1; __v = __v + 1) {
        ::std::__detail::
        _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->buffers_with_free_space,__v);
      }
      NextBufferWithFreeSpace(this);
      return;
    }
    pvVar2 = vector<unsigned_long,_true>::get<true>(local_70,__n);
    buffer_id = *pvVar2;
    if (local_78 < buffer_id) break;
    pvVar3 = vector<duckdb::BlockPointer,_true>::get<true>(local_80,__n);
    buffer_block_pointer.block_id = pvVar3->block_id;
    buffer_block_pointer.offset = pvVar3->offset;
    buffer_block_pointer.unused_padding = pvVar3->unused_padding;
    pvVar2 = vector<unsigned_long,_true>::get<true>(local_88,__n);
    segment_count = *pvVar2;
    pvVar2 = vector<unsigned_long,_true>::get<true>(&info->allocation_sizes,__n);
    allocation_size = *pvVar2;
    make_uniq<duckdb::FixedSizeBuffer,duckdb::BlockManager&,unsigned_long&,unsigned_long&,duckdb::BlockPointer&>
              ((duckdb *)&local_98,this->block_manager,&segment_count,&allocation_size,
               &buffer_block_pointer);
    this_00 = (__uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
               *)::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->buffers,&buffer_id);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
    .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl =
         local_98._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
         .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl;
    local_98._M_t.
    super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
    .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl =
         (tuple<duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>)
         (_Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
         )0x0;
    ::std::__uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>::
    reset(this_00,(pointer)__p._M_t.
                           super__Tuple_impl<0UL,_duckdb::FixedSizeBuffer_*,_std::default_delete<duckdb::FixedSizeBuffer>_>
                           .super__Head_base<0UL,_duckdb::FixedSizeBuffer_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>::
    ~unique_ptr((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
                 *)&local_98);
    this->total_segment_count = this->total_segment_count + segment_count;
    __n = __n + 1;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&buffer_block_pointer,
             "Initializing invalid buffer ID in FixedSizeAllocator::Init",
             (allocator *)&segment_count);
  InternalException::InternalException(this_01,(string *)&buffer_block_pointer);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FixedSizeAllocator::Init(const FixedSizeAllocatorInfo &info) {
	segment_size = info.segment_size;
	total_segment_count = 0;

	for (idx_t i = 0; i < info.buffer_ids.size(); i++) {

		// read all FixedSizeBuffer data
		auto buffer_id = info.buffer_ids[i];

		// Memory safety check.
		if (buffer_id > idx_t(MAX_ROW_ID)) {
			throw InternalException("Initializing invalid buffer ID in FixedSizeAllocator::Init");
		}

		auto buffer_block_pointer = info.block_pointers[i];
		auto segment_count = info.segment_counts[i];
		auto allocation_size = info.allocation_sizes[i];

		// create the FixedSizeBuffer
		buffers[buffer_id] =
		    make_uniq<FixedSizeBuffer>(block_manager, segment_count, allocation_size, buffer_block_pointer);
		total_segment_count += segment_count;
	}

	for (const auto &buffer_id : info.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id);
	}
	NextBufferWithFreeSpace();
}